

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O1

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
::resize(raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned_long,_VarState>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VarState>_>_>
         *this,size_t new_capacity)

{
  size_t hash;
  ctrl_t *p;
  slot_type *pptVar1;
  size_t capacity;
  undefined1 auVar2 [16];
  size_t sVar3;
  FindInfo FVar4;
  Layout LVar5;
  
  if ((new_capacity != 0) && ((new_capacity + 1 & new_capacity) == 0)) {
    p = this->ctrl_;
    pptVar1 = this->slots_;
    capacity = this->capacity_;
    this->capacity_ = new_capacity;
    initialize_slots(this);
    if (capacity != 0) {
      sVar3 = 0;
      do {
        if (-1 < p[sVar3]) {
          auVar2._8_8_ = 0;
          auVar2._0_8_ = pptVar1[sVar3]->first;
          hash = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar2,0);
          FVar4 = find_first_non_full(this,hash);
          set_ctrl(this,FVar4.offset,(byte)hash & 0x7f);
          this->slots_[FVar4.offset] = pptVar1[sVar3];
        }
        sVar3 = sVar3 + 1;
      } while (capacity != sVar3);
      LVar5 = MakeLayout(capacity);
      Deallocate<8ul,std::allocator<std::pair<unsigned_long_const,VarState>>>
                ((allocator<std::pair<const_unsigned_long,_VarState>_> *)&this->settings_,p,
                 (LVar5.
                  super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_unsigned_long,_VarState>_*>
                  .size_[0] + 7 & 0xfffffffffffffff8) +
                 LVar5.
                 super_LayoutType<sizeof___(Ts),_signed_char,_std::pair<const_unsigned_long,_VarState>_*>
                 .size_[1] * 8);
      return;
    }
    return;
  }
  __assert_fail("IsValidCapacity(new_capacity)",
                "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x72d,
                "void phmap::container_internal::raw_hash_set<phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, VarState>>>::resize(size_t) [Policy = phmap::container_internal::NodeHashMapPolicy<unsigned long, VarState>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, VarState>>]"
               );
}

Assistant:

inline bool IsValidCapacity(size_t n) { return ((n + 1) & n) == 0 && n > 0; }